

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

void __thiscall absl::lts_20250127::Cord::ChunkIterator::AdvanceBytes(ChunkIterator *this,size_t n)

{
  char **ppcVar1;
  size_t *psVar2;
  CordRepBtreeReader *this_00;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  string_view sVar6;
  
  if (this->bytes_remaining_ < n) {
    __assert_fail("bytes_remaining_ >= n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                  ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
  }
  if ((this->current_chunk_)._M_len <= n) {
    if (n != 0) {
      lVar4 = (long)(this->btree_reader_).navigator_.height_;
      if ((-1 < lVar4) && ((this->btree_reader_).navigator_.node_[lVar4] != (CordRepBtree *)0x0)) {
        uVar3 = (this->current_chunk_)._M_len;
        if (uVar3 <= n) {
          psVar2 = &this->bytes_remaining_;
          *psVar2 = *psVar2 - n;
          if (*psVar2 == 0) {
            (this->current_chunk_)._M_len = 0;
            (this->current_chunk_)._M_str = (char *)0x0;
          }
          else {
            this_00 = &this->btree_reader_;
            if (uVar3 == n) {
              sVar6 = cord_internal::CordRepBtreeReader::Next(this_00);
            }
            else {
              sVar5 = cord_internal::CordRepBtreeReader::length(this_00);
              sVar6 = cord_internal::CordRepBtreeReader::Seek
                                (this_00,sVar5 - this->bytes_remaining_);
            }
            this->current_chunk_ = sVar6;
          }
          return;
        }
        __assert_fail("n >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                      ,0x600,"void absl::Cord::ChunkIterator::AdvanceBytesBtree(size_t)");
      }
      this->bytes_remaining_ = 0;
    }
    return;
  }
  uVar3 = (this->current_chunk_)._M_len;
  sVar5 = uVar3 - n;
  if (n <= uVar3 && sVar5 != 0) {
    ppcVar1 = &(this->current_chunk_)._M_str;
    *ppcVar1 = *ppcVar1 + n;
    (this->current_chunk_)._M_len = sVar5;
    this->bytes_remaining_ = this->bytes_remaining_ - n;
    return;
  }
  __assert_fail("n < current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                ,0x637,"void absl::Cord::ChunkIterator::RemoveChunkPrefix(size_t)");
}

Assistant:

inline void Cord::ChunkIterator::AdvanceBytes(size_t n) {
  assert(bytes_remaining_ >= n);
  if (ABSL_PREDICT_TRUE(n < current_chunk_.size())) {
    RemoveChunkPrefix(n);
  } else if (n != 0) {
    if (btree_reader_) {
      AdvanceBytesBtree(n);
    } else {
      bytes_remaining_ = 0;
    }
  }
}